

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

bool __thiscall
glcts::GeometryShaderMaxTextureUnitsTest::verifyResult
          (GeometryShaderMaxTextureUnitsTest *this,void *data)

{
  ostringstream *this_00;
  uint uVar1;
  pointer p_Var2;
  int iVar3;
  uint uVar4;
  MessageBuilder *this_01;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  GLint expected_value;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  uVar1 = this->m_max_texture_units;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  p_Var2 = (this->m_textures).
           super__Vector_base<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = 0;
  do {
    if (uVar6 == uVar8) {
LAB_00ce68a5:
      return (long)(int)uVar1 <= (long)uVar6;
    }
    iVar3 = ((int)(uVar6 + 1) * (p_Var2[uVar6].data + p_Var2->data)) / 2;
    uVar4 = uVar7;
    for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
      uVar5 = uVar4;
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        if (*(int *)((long)data + (ulong)uVar5) != iVar3) {
          local_1b0 = (undefined1  [8])
                      ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.
                       super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::operator<<(&local_1a8,"Wrong result! Expected: ");
          std::ostream::operator<<(&local_1a8,iVar3);
          std::operator<<(&local_1a8," Extracted: ");
          this_01 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,(int *)((long)data + (ulong)uVar5));
          this_00 = &this_01->m_str;
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," Point: ");
          std::ostream::operator<<(this_00,(int)uVar6);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," X: ");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," Y: ");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          goto LAB_00ce68a5;
        }
        uVar5 = uVar5 + 0x10;
      }
      uVar4 = uVar4 + this->m_texture_width * 0x10;
    }
    uVar7 = uVar7 + 0x20;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool GeometryShaderMaxTextureUnitsTest::verifyResult(const void* data)
{
	const unsigned char* result_image = (const unsigned char*)data;
	const unsigned int   line_size	= m_texture_width * m_texture_pixel_size;

	/* For each drawn point */
	for (glw::GLint point = 0; point < m_max_texture_units; ++point)
	{
		const glw::GLint   first_value	= m_textures[0].data;
		const glw::GLint   last_value	 = m_textures[point].data;
		const glw::GLint   expected_value = ((first_value + last_value) * (point + 1)) / 2;
		const unsigned int point_offset   = point * m_texture_pixel_size * m_point_size;

		/* Verify all pixels that belong to point, area m_point_size x m_point_size */
		for (unsigned int y = 0; y < m_point_size; ++y)
		{
			const unsigned int line_offset		  = y * line_size;
			const unsigned int first_texel_offset = line_offset + point_offset;

			for (unsigned int x = 0; x < m_point_size; ++x)
			{
				const unsigned int texel_offset = first_texel_offset + x * m_texture_pixel_size;

				if (0 != memcmp(result_image + texel_offset, &expected_value, sizeof(expected_value)))
				{
					glw::GLint* result_value = (glw::GLint*)(result_image + texel_offset);

					m_testCtx.getLog() << tcu::TestLog::Message << "Wrong result! "
																   "Expected: "
									   << expected_value << " Extracted: " << *result_value << " Point: " << point
									   << " X: " << x << " Y: " << y << tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}